

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlDependence.h
# Opt level: O2

ValVec * __thiscall
dg::LLVMControlDependenceAnalysis::_getDependencies<llvm::Instruction_const*>
          (ValVec *__return_storage_ptr__,LLVMControlDependenceAnalysis *this,Instruction *v)

{
  ValVec interproc;
  _Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_> local_30;
  
  (**(code **)(**(long **)(this + 0x68) + 0x28))();
  if (this[100] == (LLVMControlDependenceAnalysis)0x1) {
    (**(code **)(**(long **)(this + 0x70) + 0x28))(&local_30,*(long **)(this + 0x70),v);
    std::vector<llvm::Value*,std::allocator<llvm::Value*>>::
    insert<__gnu_cxx::__normal_iterator<llvm::Value**,std::vector<llvm::Value*,std::allocator<llvm::Value*>>>,void>
              ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)__return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->
               super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                )local_30._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                )local_30._M_impl.super__Vector_impl_data._M_finish);
    std::_Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~_Vector_base(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

ValVec _getDependencies(ValT v) {
        assert(_impl);
        auto ret = _impl->getDependencies(v);

        if (getOptions().interproceduralCD()) {
            assert(_interprocImpl);
            auto interproc = _interprocImpl->getDependencies(v);
            ret.insert(ret.end(), interproc.begin(), interproc.end());
        }
        return ret;
    }